

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

void helper_stmw_ppc64(CPUPPCState_conflict2 *env,target_ulong addr,uint32_t reg)

{
  int mmu_idx_00;
  uintptr_t unaff_retaddr;
  void *local_38;
  char *host;
  int mmu_idx;
  uintptr_t raddr;
  target_ulong tStack_18;
  uint32_t reg_local;
  target_ulong addr_local;
  CPUPPCState_conflict2 *env_local;
  
  mmu_idx_00 = cpu_mmu_index(env,false);
  local_38 = probe_contiguous(env,addr,(0x20 - reg) * 4,MMU_DATA_STORE,mmu_idx_00,unaff_retaddr);
  raddr._4_4_ = reg;
  tStack_18 = addr;
  if (local_38 == (void *)0x0) {
    for (; raddr._4_4_ < 0x20; raddr._4_4_ = raddr._4_4_ + 1) {
      cpu_stl_mmuidx_ra_ppc64
                (env,tStack_18,(uint32_t)env->gpr[raddr._4_4_],mmu_idx_00,unaff_retaddr);
      tStack_18 = addr_add(env,tStack_18,4);
    }
  }
  else {
    for (; raddr._4_4_ < 0x20; raddr._4_4_ = raddr._4_4_ + 1) {
      stl_be_p(local_38,(uint32_t)env->gpr[raddr._4_4_]);
      local_38 = (void *)((long)local_38 + 4);
    }
  }
  return;
}

Assistant:

void helper_stmw(CPUPPCState *env, target_ulong addr, uint32_t reg)
{
    uintptr_t raddr = GETPC();
    int mmu_idx = cpu_mmu_index(env, false);
    char *host = probe_contiguous(env, addr, (32 - reg) * 4,
                                  MMU_DATA_STORE, mmu_idx, raddr);

    if (likely(host)) {
        /* Fast path -- the entire operation is in RAM at host.  */
        for (; reg < 32; reg++) {
            stl_be_p(host, env->gpr[reg]);
            host += 4;
        }
    } else {
        /* Slow path -- at least some of the operation requires i/o.  */
        for (; reg < 32; reg++) {
            cpu_stl_mmuidx_ra(env, addr, env->gpr[reg], mmu_idx, raddr);
            addr = addr_add(env, addr, 4);
        }
    }
}